

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall
kratos::StmtScopeVisitor::StmtScopeVisitor
          (StmtScopeVisitor *this,Module *module,Generator *gen,
          map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          *stmt_fn_ln,
          unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *enable_conditions)

{
  unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *enable_conditions_local;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *stmt_fn_ln_local;
  Generator *gen_local;
  Module *module_local;
  StmtScopeVisitor *this_local;
  
  IRVisitor::IRVisitor(&this->super_IRVisitor);
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_0058b3c8;
  this->module_ = module;
  this->gen_ = gen;
  std::
  unordered_map<const_kratos::Stmt_*,_hgdb::json::Scope<std::nullptr_t>_*,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>_>
  ::unordered_map(&this->stmt_scope_mapping_);
  this->stmt_fn_ln_ = stmt_fn_ln;
  this->enable_conditions_ = enable_conditions;
  return;
}

Assistant:

StmtScopeVisitor(hgdb::json::Module &module, const Generator *gen,
                     const std::map<const Stmt *, std::pair<std::string, uint32_t>> &stmt_fn_ln,
                     const std::unordered_map<const Stmt *, std::string> &enable_conditions)
        : module_(module),
          gen_(gen),
          stmt_fn_ln_(stmt_fn_ln),
          enable_conditions_(enable_conditions) {}